

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

void SN_UpdateActiveSequences(void)

{
  DSeqNode *this;
  DSeqNode **ppDVar1;
  
  if ((ActiveSequences != 0) && (paused == 0)) {
    ppDVar1 = &DSeqNode::SequenceListHead;
    while (this = *ppDVar1, this != (DSeqNode *)0x0) {
      DSeqNode::Tick(this);
      ppDVar1 = &this->m_Next;
    }
  }
  return;
}

Assistant:

void SN_UpdateActiveSequences (void)
{
	DSeqNode *node;

	if (!ActiveSequences || paused)
	{ // No sequences currently playing/game is paused
		return;
	}
	for (node = DSeqNode::FirstSequence(); node; node = node->NextSequence())
	{
		node->Tick ();
	}
}